

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.h
# Opt level: O0

void __thiscall adios2::core::engine::ssc::Buffer::Buffer(Buffer *this,size_t capacity)

{
  void *pvVar1;
  size_t in_RSI;
  size_t *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  pvVar1 = malloc(in_RSI);
  in_RDI[2] = (size_t)pvVar1;
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  return;
}

Assistant:

Buffer(const size_t capacity = 1)
    {
        m_Buffer = reinterpret_cast<uint8_t *>(malloc(capacity));
        m_Capacity = capacity;
        m_Size = 0;
    }